

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ClampWindowRect(ImGuiWindow *window,ImRect *visibility_rect)

{
  long in_RSI;
  long in_RDI;
  ImVec2 IVar1;
  ImVec2 size_for_clamping;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffb8;
  ImGuiWindow *in_stack_ffffffffffffffd0;
  ImVec2 in_stack_ffffffffffffffd8;
  
  if ((((GImGui->IO).ConfigWindowsMoveFromTitleBarOnly & 1U) != 0) &&
     ((*(uint *)(in_RDI + 0xc) & 1) == 0)) {
    ImGuiWindow::TitleBarHeight(in_stack_ffffffffffffffd0);
  }
  IVar1 = operator-(in_stack_ffffffffffffffb8,(ImVec2 *)0x13b4c6);
  IVar1 = ImClamp((ImVec2 *)IVar1,*(ImVec2 **)(in_RSI + 8),in_stack_ffffffffffffffd8);
  *(ImVec2 *)(in_RDI + 0x10) = IVar1;
  return;
}

Assistant:

static inline void ClampWindowRect(ImGuiWindow* window, const ImRect& visibility_rect)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size_for_clamping = window->Size;
    if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(window->Flags & ImGuiWindowFlags_NoTitleBar))
        size_for_clamping.y = window->TitleBarHeight();
    window->Pos = ImClamp(window->Pos, visibility_rect.Min - size_for_clamping, visibility_rect.Max);
}